

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shm.h
# Opt level: O0

void __thiscall
HalosExchange::HalosExchange
          (HalosExchange *this,int rank,int n_processes,int n_partners,int message_size)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  ulong uVar5;
  _func_int **pp_Var6;
  ostream *poVar7;
  _func_int *p_Var8;
  int in_ECX;
  int in_ESI;
  Computation *in_RDI;
  int in_R8D;
  int i;
  int sod;
  int failed;
  int *in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  int local_30;
  
  Computation::Computation(in_RDI);
  in_RDI->_vptr_Computation = (_func_int **)&PTR__HalosExchange_00118c28;
  in_RDI[4]._vptr_Computation = (_func_int **)0x0;
  in_RDI[7]._vptr_Computation = (_func_int **)0x0;
  *(int *)&in_RDI[1]._vptr_Computation = in_ESI;
  *(int *)&in_RDI[3]._vptr_Computation = in_ECX;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)in_ECX;
  uVar5 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  pp_Var6 = (_func_int **)operator_new__(uVar5);
  in_RDI[2]._vptr_Computation = pp_Var6;
  iVar4 = find_partners((int)in_RDI,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,
                        in_stack_ffffffffffffffb0);
  if (iVar4 != 0) {
    MPI_Abort(&ompi_mpi_comm_world,1);
  }
  if (in_R8D % 8 != 0) {
    if (in_ESI == 0) {
      poVar7 = std::operator<<((ostream *)&std::cerr,"Message size must be a multiple of ");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,8);
      std::operator<<(poVar7,"\n");
    }
    MPI_Abort(&ompi_mpi_comm_world,1);
  }
  *(int *)&in_RDI[6]._vptr_Computation = in_R8D / 8;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)in_ECX;
  uVar5 = SUB168(auVar2 * ZEXT816(8),0);
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  pp_Var6 = (_func_int **)operator_new__(uVar5);
  in_RDI[5]._vptr_Computation = pp_Var6;
  for (local_30 = 0; local_30 < in_ECX; local_30 = local_30 + 1) {
    auVar3._8_8_ = 0;
    auVar3._0_8_ = (long)*(int *)&in_RDI[6]._vptr_Computation;
    uVar5 = SUB168(auVar3 * ZEXT816(8),0);
    if (SUB168(auVar3 * ZEXT816(8),8) != 0) {
      uVar5 = 0xffffffffffffffff;
    }
    p_Var8 = (_func_int *)operator_new__(uVar5);
    in_RDI[5]._vptr_Computation[local_30] = p_Var8;
  }
  return;
}

Assistant:

HalosExchange(int rank, int n_processes, int n_partners, int message_size)
    {
        this->rank = rank;
        this->n_partners = n_partners;
        this->partners = new int[n_partners];
        int failed = find_partners(rank, n_processes, n_partners, partners);
        if (failed) MPI_Abort(MPI_COMM_WORLD, 1);
        int sod = sizeof(double);
        if (message_size % sod != 0)
        {
            if (rank == 0)
                std::cerr << "Message size must be a multiple of " << sod << "\n";
            MPI_Abort(MPI_COMM_WORLD, 1);
        }
        this->n_elements = message_size / sod;
        this->rbuf = new double*[n_partners];
        for (int i = 0; i < n_partners; i++)
            rbuf[i] = new double[n_elements];
    }